

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

gguf_context * gguf_init_from_file(char *fname,gguf_init_params params)

{
  FILE *__stream;
  gguf_context *pgVar1;
  gguf_init_params params_00;
  
  params_00.ctx = params.ctx;
  __stream = (FILE *)ggml_fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"%s: failed to open GGUF file \'%s\'\n","gguf_init_from_file",fname);
    pgVar1 = (gguf_context *)0x0;
  }
  else {
    params_00._0_8_ = params._0_8_ & 0xff;
    pgVar1 = gguf_init_from_file_impl((FILE *)__stream,params_00);
    fclose(__stream);
  }
  return pgVar1;
}

Assistant:

struct gguf_context * gguf_init_from_file(const char * fname, struct gguf_init_params params) {
    FILE * file = ggml_fopen(fname, "rb");

    if (!file) {
        fprintf(stderr, "%s: failed to open GGUF file '%s'\n", __func__, fname);
        return nullptr;
    }

    struct gguf_context * result = gguf_init_from_file_impl(file, params);
    fclose(file);
    return result;
}